

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

void modstl(double *x,int N,int f,int *s_window,double *lambda,double *seasonal,double *trend,
           double *remainder)

{
  double *y_00;
  double *x_00;
  int local_4c;
  double *t;
  double *y;
  int s_window_;
  int i;
  double *seasonal_local;
  double *lambda_local;
  int *s_window_local;
  int f_local;
  int N_local;
  double *x_local;
  
  if (s_window == (int *)0x0) {
    local_4c = 0xd;
  }
  else {
    local_4c = *s_window;
  }
  y._0_4_ = local_4c;
  _s_window_ = seasonal;
  seasonal_local = lambda;
  lambda_local = (double *)s_window;
  s_window_local._0_4_ = f;
  s_window_local._4_4_ = N;
  _f_local = x;
  y_00 = (double *)malloc((long)N << 3);
  if (seasonal_local == (double *)0x0) {
    memcpy(y_00,_f_local,(long)s_window_local._4_4_ << 3);
  }
  else {
    boxcox(_f_local,s_window_local._4_4_,seasonal_local,y_00);
  }
  if ((int)s_window_local < 2) {
    x_00 = (double *)malloc((long)s_window_local._4_4_ << 3);
    for (y._4_4_ = 0; y._4_4_ < s_window_local._4_4_; y._4_4_ = y._4_4_ + 1) {
      x_00[y._4_4_] = (double)y._4_4_;
    }
    supsmu(x_00,s_window_local._4_4_,y_00,(double *)0x0,1,0.0,-1.0,trend);
    for (y._4_4_ = 0; y._4_4_ < s_window_local._4_4_; y._4_4_ = y._4_4_ + 1) {
      _s_window_[y._4_4_] = 0.0;
      remainder[y._4_4_] = y_00[y._4_4_] - trend[y._4_4_];
    }
    free(x_00);
  }
  else {
    stl(y_00,s_window_local._4_4_,(int)s_window_local,"null",(int *)&y,(int *)0x0,(int *)0x0,
        (int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0,
        (int *)0x0,_s_window_,trend,remainder);
  }
  free(y_00);
  return;
}

Assistant:

void modstl(double *x, int N, int f, int *s_window,double *lambda, double *seasonal, double *trend,double *remainder) {
    int i, s_window_;
    double *y,*t;


    s_window_ = (s_window == NULL) ? 13 : *s_window;

    y = (double*)malloc(sizeof(double)*N);

    if (lambda != NULL) {
        boxcox(x,N,lambda,y);
    } else {
        memcpy(y,x,sizeof(double)*N);
    }

    if (f > 1) {
        stl(y,N,f,"null",&s_window_,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,NULL,seasonal,trend,remainder);
    } else {
        t = (double*) malloc(sizeof(double)*N);
        for(i = 0; i < N;++i) {
            t[i] = i;
        }
        supsmu(t,N,y,NULL,1,0,-1.0,trend);
        for(i = 0; i < N;++i) {
            seasonal[i] = 0.0;
            remainder[i] = y[i] - trend[i];
        }
        free(t);
    }

    free(y);
}